

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *interfaceNode)

{
  bool bVar1;
  ListElementCount LVar2;
  uint64_t uVar3;
  uint index;
  ulong count;
  StringPtr name;
  bool _kjCondition;
  Reader *local_170;
  Array<bool> sawCodeOrder_heap;
  anon_class_8_1_60e9c21f _kjContextFunc438;
  IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
  local_148;
  Reader method;
  Reader methods;
  Fault f;
  uint local_d0;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:438:7)>
  _kjContext438;
  bool sawCodeOrder_stack [32];
  
  local_170 = interfaceNode;
  capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)&_kjContext438,interfaceNode);
  f.exception = (Exception *)&_kjContext438;
  for (local_d0 = 0; local_d0 != _kjContext438.super_Context.value.ptr._0_4_;
      local_d0 = local_d0 + 1) {
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
    ::operator*((Reader *)&methods,
                (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                 *)&f);
    if (methods.reader.structDataSize < 0x40) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(uint64_t *)methods.reader.ptr;
    }
    validateTypeId(this,uVar3,INTERFACE);
    capnp::schema::Superclass::Reader::getBrand((Reader *)&method,(Reader *)&methods);
    validate(this,(Reader *)&method);
  }
  capnp::schema::Node::Interface::Reader::getMethods(&methods,local_170);
  count = (ulong)methods.reader.elementCount;
  if (count < 0x21) {
    sawCodeOrder_heap.ptr = (bool *)0x0;
    sawCodeOrder_heap.size_ = 0;
    sawCodeOrder_heap.disposer = (ArrayDisposer *)0x0;
    local_170 = (Reader *)sawCodeOrder_stack;
  }
  else {
    local_170 = (Reader *)kj::_::HeapArrayDisposer::allocate<bool>(count);
    sawCodeOrder_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawCodeOrder_heap.ptr = (bool *)local_170;
    sawCodeOrder_heap.size_ = count;
  }
  memset(local_170,0,count);
  LVar2 = methods.reader.elementCount;
  index = 0;
  local_148.container = &methods;
  for (local_148.index = 0; local_148.index != LVar2; local_148.index = local_148.index + 1) {
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
    ::operator*(&method,&local_148);
    _kjContextFunc438.method = &method;
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:438:7)>
    ::ContextImpl(&_kjContext438,&_kjContextFunc438);
    name.content = (ArrayPtr<const_char>)capnp::schema::Method::Reader::getName(&method);
    validateMemberName(this,name,index);
    if (method._reader.dataSize < 0x10) {
      if (methods.reader.elementCount == 0) {
LAB_0019a3a2:
        _kjCondition = false;
      }
      else {
        _kjCondition = (bool)(*(bool *)local_170 ^ 1);
        if (*(bool *)local_170 == false) {
          *(bool *)local_170 = true;
LAB_0019a39e:
          uVar3 = 0;
          goto LAB_0019a3f0;
        }
      }
LAB_0019a3a7:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[18]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x1bb,FAILED,
                 "method.getCodeOrder() < methods.size() && !sawCodeOrder[method.getCodeOrder()]",
                 "_kjCondition,\"invalid codeOrder\"",&_kjCondition,
                 (char (*) [18])"invalid codeOrder");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
      bVar1 = false;
    }
    else {
      if (methods.reader.elementCount <= *method._reader.data) goto LAB_0019a3a2;
      _kjCondition = (bool)(*(bool *)((long)local_170 + (ulong)*method._reader.data) ^ 1);
      if (*(bool *)((long)local_170 + (ulong)*method._reader.data) != false) goto LAB_0019a3a7;
      *(bool *)((long)local_170 + (ulong)*method._reader.data) = true;
      if (method._reader.dataSize < 0x80) goto LAB_0019a39e;
      uVar3 = *(uint64_t *)((long)method._reader.data + 8);
LAB_0019a3f0:
      validateTypeId(this,uVar3,STRUCT);
      capnp::schema::Method::Reader::getParamBrand((Reader *)&f,&method);
      validate(this,(Reader *)&f);
      if (method._reader.dataSize < 0xc0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(uint64_t *)((long)method._reader.data + 0x10);
      }
      validateTypeId(this,uVar3,STRUCT);
      capnp::schema::Method::Reader::getResultBrand((Reader *)&f,&method);
      validate(this,(Reader *)&f);
      bVar1 = true;
    }
    kj::_::Debug::Context::~Context(&_kjContext438.super_Context);
    if (!bVar1) break;
    index = index + 1;
  }
  kj::Array<bool>::~Array(&sawCodeOrder_heap);
  return;
}

Assistant:

void validate(const schema::Node::Interface::Reader& interfaceNode) {
    for (auto extend: interfaceNode.getSuperclasses()) {
      validateTypeId(extend.getId(), schema::Node::INTERFACE);
      validate(extend.getBrand());
    }

    auto methods = interfaceNode.getMethods();
    KJ_STACK_ARRAY(bool, sawCodeOrder, methods.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto method: methods) {
      KJ_CONTEXT("validating method", method.getName());
      validateMemberName(method.getName(), index++);

      VALIDATE_SCHEMA(method.getCodeOrder() < methods.size() &&
                      !sawCodeOrder[method.getCodeOrder()],
                      "invalid codeOrder");
      sawCodeOrder[method.getCodeOrder()] = true;

      validateTypeId(method.getParamStructType(), schema::Node::STRUCT);
      validate(method.getParamBrand());
      validateTypeId(method.getResultStructType(), schema::Node::STRUCT);
      validate(method.getResultBrand());
    }
  }